

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmDefinitions::ClosureKeys_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmDefinitions *this,StackIter begin,StackIter end)

{
  iterator other;
  bool bVar1;
  size_type sVar2;
  PointerType pcVar3;
  size_type sVar4;
  string *__x;
  pair<std::__detail::_Node_iterator<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>,_bool>
  pVar5;
  bool local_132;
  string_view local_e8;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_d8;
  undefined1 local_d0;
  reference local_c8;
  pair<const_cm::String,_cmDefinitions::Def> *mi;
  iterator __end2;
  iterator __begin2;
  unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
  *__range2;
  undefined1 local_80 [8];
  StackIter it;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  bound;
  StackIter end_local;
  StackIter begin_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *defined;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::unordered_set((unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)&it.Position);
  local_80 = (undefined1  [8])this;
  it.Tree = begin.Tree;
  while (other.Position = (PositionType)end.Tree,
        other.Tree = (cmLinkedTree<cmDefinitions> *)begin.Position,
        bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator!=((iterator *)local_80,other), bVar1
        ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(__return_storage_ptr__);
    pcVar3 = cmLinkedTree<cmDefinitions>::iterator::operator->((iterator *)local_80);
    sVar4 = std::
            unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
            ::size(&pcVar3->Map);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(__return_storage_ptr__,sVar2 + sVar4);
    pcVar3 = cmLinkedTree<cmDefinitions>::iterator::operator->((iterator *)local_80);
    __end2 = std::
             unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
             ::begin(&pcVar3->Map);
    mi = (pair<const_cm::String,_cmDefinitions::Def> *)
         std::
         unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
         ::end(&pcVar3->Map);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false>
                              ,(_Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false>
                                *)&mi), bVar1) {
      local_c8 = std::__detail::
                 _Node_iterator<std::pair<const_cm::String,_cmDefinitions::Def>,_false,_false>::
                 operator*(&__end2);
      local_e8 = ::cm::String::view(&local_c8->first);
      pVar5 = std::
              unordered_set<std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::emplace<std::basic_string_view<char,std::char_traits<char>>>
                        ((unordered_set<std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)&it.Position,&local_e8);
      local_d8._M_cur =
           (__node_type *)
           pVar5.first.
           super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
           _M_cur;
      local_d0 = pVar5.second;
      local_132 = false;
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_132 = ::cm::String::operator_cast_to_bool(&(local_c8->second).Value);
      }
      if (local_132 != false) {
        __x = ::cm::String::str_if_stable_abi_cxx11_(&local_c8->first);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,__x);
      }
      std::__detail::_Node_iterator<std::pair<const_cm::String,_cmDefinitions::Def>,_false,_false>::
      operator++(&__end2);
    }
    cmLinkedTree<cmDefinitions>::iterator::operator++((iterator *)local_80);
  }
  std::
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~unordered_set((unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)&it.Position);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmDefinitions::ClosureKeys(StackIter begin,
                                                    StackIter end)
{
  std::vector<std::string> defined;
  std::unordered_set<cm::string_view> bound;

  for (StackIter it = begin; it != end; ++it) {
    defined.reserve(defined.size() + it->Map.size());
    for (auto const& mi : it->Map) {
      // Use this key if it is not already set or unset.
      if (bound.emplace(mi.first.view()).second && mi.second.Value) {
        defined.push_back(*mi.first.str_if_stable());
      }
    }
  }

  return defined;
}